

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

uchar cmdline::detail::
      lexical_cast_t<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ::cast(string *arg)

{
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  bad_cast *this;
  istringstream local_198 [8];
  istringstream ss;
  uchar local_11;
  string *psStack_10;
  uchar ret;
  string *arg_local;
  
  psStack_10 = arg;
  std::__cxx11::istringstream::istringstream(local_198,arg,8);
  piVar3 = std::operator>>((istream *)local_198,&local_11);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
  if ((bVar1) && (bVar2 = std::ios::eof(), (bVar2 & 1) != 0)) {
    std::__cxx11::istringstream::~istringstream(local_198);
    return local_11;
  }
  this = (bad_cast *)__cxa_allocate_exception(8);
  std::bad_cast::bad_cast(this);
  __cxa_throw(this,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static Target cast(const std::string &arg){
                        Target ret;
                        std::istringstream ss(arg);
                        if (!(ss >> ret && ss.eof()))
                            throw std::bad_cast();
                        return ret;
                    }